

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void display_tree_dfs(log_multi *b,node *node,uint32_t depth)

{
  ostream *poVar1;
  uint32_t uVar2;
  size_t i;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = depth;
  while( true ) {
    while (bVar4 = depth != 0, depth = depth - 1, bVar4) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout," label = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," labels = ");
    for (uVar3 = 0; uVar3 < (ulong)(((long)(node->preds)._end - (long)(node->preds)._begin) / 0x18);
        uVar3 = uVar3 + 1) {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (node->internal == false) break;
    std::operator<<((ostream *)&std::cout,"Left");
    depth = uVar2 + 1;
    display_tree_dfs(b,(b->nodes)._begin + node->left,depth);
    std::operator<<((ostream *)&std::cout,"Right");
    node = (b->nodes)._begin + node->right;
    uVar2 = depth;
  }
  return;
}

Assistant:

void display_tree_dfs(log_multi& b, const node& node, uint32_t depth)
{
  for (uint32_t i = 0; i < depth; i++) cout << "\t";
  cout << node.min_count << " " << node.left << " " << node.right;
  cout << " label = " << node.max_count_label << " labels = ";
  for (size_t i = 0; i < node.preds.size(); i++)
    cout << node.preds[i].label << ":" << node.preds[i].label_count << "\t";
  cout << endl;

  if (node.internal)
  {
    cout << "Left";
    display_tree_dfs(b, b.nodes[node.left], depth + 1);

    cout << "Right";
    display_tree_dfs(b, b.nodes[node.right], depth + 1);
  }
}